

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O2

void GEN_CS::gen_cs_example_mtr(cb_to_cs_adf *c,multi_ex *ec_seq,label *cs_labels)

{
  pointer ppeVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  wclass wc;
  undefined1 local_48 [24];
  
  c->action_sum =
       ((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3) + c->action_sum;
  c->event_sum = c->event_sum + 1;
  ppeVar1 = (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppeVar1) {
    (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppeVar1;
  }
  v_array<COST_SENSITIVE::wclass>::clear(&cs_labels->costs);
  lVar4 = 0;
  for (uVar5 = 0;
      ppeVar1 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar1 >> 3);
      uVar5 = uVar5 + 1) {
    lVar2 = *(long *)((long)ppeVar1 + lVar4);
    pfVar3 = *(float **)(lVar2 + 0x6828);
    if (*(long *)(lVar2 + 0x6830) - (long)pfVar3 == 0x10) {
      local_48._0_4_ = *pfVar3;
      if (((float)local_48._0_4_ != 3.4028235e+38) || (NAN((float)local_48._0_4_))) {
        local_48._4_12_ = SUB1612((undefined1  [16])0x0,4);
        c->mtr_example = (uint32_t)uVar5;
        std::vector<example_*,_std::allocator<example_*>_>::push_back
                  (&c->mtr_ec_seq,
                   (value_type *)
                   ((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar4));
        v_array<COST_SENSITIVE::wclass>::push_back(&cs_labels->costs,(wclass *)local_48);
      }
    }
    lVar4 = lVar4 + 8;
  }
  return;
}

Assistant:

void gen_cs_example_mtr(cb_to_cs_adf& c, multi_ex& ec_seq, COST_SENSITIVE::label& cs_labels)
{
  c.action_sum += ec_seq.size();
  c.event_sum++;

  c.mtr_ec_seq.clear();
  cs_labels.costs.clear();
  for (size_t i = 0; i < ec_seq.size(); i++)
  {
    CB::label ld = ec_seq[i]->l.cb;

    COST_SENSITIVE::wclass wc = {0, 0, 0, 0};

    bool keep_example = false;
    if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
    {
      wc.x = ld.costs[0].cost;
      c.mtr_example = (uint32_t)i;
      keep_example = true;
    }
    if (keep_example)
    {
      c.mtr_ec_seq.push_back(ec_seq[i]);
      cs_labels.costs.push_back(wc);
    }
  }
}